

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCVal2(btok_cvc_t *cvc,octet *cert,size_t cert_len,btok_cvc_t *cvca,octet *date)

{
  bool_t bVar1;
  void *in_RCX;
  void *in_RDI;
  void *in_R8;
  void *stack;
  err_t code;
  octet *in_stack_00000040;
  btok_cvc_t *in_stack_00000048;
  octet *in_stack_ffffffffffffffb8;
  btok_cvc_t *cvca_00;
  uint in_stack_ffffffffffffffc8;
  err_t local_4;
  
  cvca_00 = (btok_cvc_t *)0x0;
  if ((((in_RDI == (void *)0x0) || (bVar1 = memIsValid(in_RDI,0x128), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RCX,0x128), bVar1 != 0)) &&
     ((in_R8 == (void *)0x0 || (bVar1 = memIsValid(in_R8,6), bVar1 != 0)))) {
    if ((in_RDI == (void *)0x0) &&
       (cvca_00 = (btok_cvc_t *)blobCreate((size_t)in_stack_ffffffffffffffb8),
       cvca_00 == (btok_cvc_t *)0x0)) {
      local_4 = 0x6e;
    }
    else {
      local_4 = btokCVCUnwrap(in_stack_00000048,in_stack_00000040,(size_t)cvc,cert,cert_len);
      if (local_4 == 0) {
        local_4 = btokCVCCheck2((btok_cvc_t *)(ulong)in_stack_ffffffffffffffc8,cvca_00);
        if (local_4 == 0) {
          if (in_R8 != (void *)0x0) {
            bVar1 = tmDateIsValid2((octet *)cvca_00);
            if (bVar1 == 0) {
              local_4 = 0x134;
            }
            else {
              bVar1 = tmDateLeq2((octet *)cvca_00,in_stack_ffffffffffffffb8);
              if ((bVar1 == 0) ||
                 (bVar1 = tmDateLeq2((octet *)cvca_00,in_stack_ffffffffffffffb8), bVar1 == 0)) {
                local_4 = 0x136;
              }
            }
          }
          blobClose((blob_t)0x172b8b);
        }
        else {
          blobClose((blob_t)0x172b14);
        }
      }
      else {
        blobClose((blob_t)0x172ae3);
      }
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t btokCVCVal2(btok_cvc_t* cvc, const octet cert[], size_t cert_len,
	const btok_cvc_t* cvca, const octet* date)
{
	err_t code;
	void* stack = 0;
	// входной контроль
	if (!memIsNullOrValid(cvc, sizeof(btok_cvc_t)) || 
		!memIsValid(cvca, sizeof(btok_cvc_t)) ||
		!memIsNullOrValid(date, 6))
		return ERR_BAD_INPUT;
	// выделить память
	if (!cvc)
	{
		stack = blobCreate(sizeof(btok_cvc_t));
		if (!stack)
			return ERR_OUTOFMEMORY;
		cvc = (btok_cvc_t*)stack;
	}
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, cvca->pubkey, cvca->pubkey_len);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить соответствие
	code = btokCVCCheck2(cvc, cvca);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить дату
	if (date)
	{
		if (!tmDateIsValid2(date))
			code = ERR_BAD_DATE;
		else if (!tmDateLeq2(cvc->from, date) || !tmDateLeq2(date, cvc->until))
			code = ERR_OUTOFRANGE;
	}
	// завершить
	blobClose(stack);
	return code;
}